

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O0

int Pla_ManExpendDirNum(word *pOn,int nBits,int iMint,int *pVars)

{
  int iVar1;
  int local_28;
  int local_24;
  int nVars;
  int v;
  int *pVars_local;
  int iMint_local;
  int nBits_local;
  word *pOn_local;
  
  local_28 = 0;
  for (local_24 = 0; local_24 < nBits; local_24 = local_24 + 1) {
    iVar1 = Pla_TtGetBit(pOn,iMint ^ 1 << ((byte)local_24 & 0x1f));
    if (iVar1 != 0) {
      pVars[local_28] = local_24;
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int Pla_ManExpendDirNum( word * pOn, int nBits, int iMint, int * pVars )
{
    int v, nVars = 0;
    for ( v = 0; v < nBits; v++ )
        if ( Pla_TtGetBit(pOn, iMint ^ (1 << v)) )
            pVars[nVars++] = v;
    return nVars;
}